

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

uint __thiscall llvm::dwarf::getVirtuality(dwarf *this,StringRef VirtualityString)

{
  uint uVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  pcVar2 = VirtualityString.Data;
  if (pcVar2 == (char *)0x1a) {
    auVar8[0] = -(this[10] == (dwarf)'I');
    auVar8[1] = -(this[0xb] == (dwarf)'T');
    auVar8[2] = -(this[0xc] == (dwarf)'Y');
    auVar8[3] = -(this[0xd] == (dwarf)'_');
    auVar8[4] = -(this[0xe] == (dwarf)'p');
    auVar8[5] = -(this[0xf] == (dwarf)'u');
    auVar8[6] = -(this[0x10] == (dwarf)'r');
    auVar8[7] = -(this[0x11] == (dwarf)'e');
    auVar8[8] = -(this[0x12] == (dwarf)'_');
    auVar8[9] = -(this[0x13] == (dwarf)'v');
    auVar8[10] = -(this[0x14] == (dwarf)'i');
    auVar8[0xb] = -(this[0x15] == (dwarf)'r');
    auVar8[0xc] = -(this[0x16] == (dwarf)'t');
    auVar8[0xd] = -(this[0x17] == (dwarf)'u');
    auVar8[0xe] = -(this[0x18] == (dwarf)'a');
    auVar8[0xf] = -(this[0x19] == (dwarf)'l');
    auVar5[0] = -(*this == (dwarf)'D');
    auVar5[1] = -(this[1] == (dwarf)'W');
    auVar5[2] = -(this[2] == (dwarf)'_');
    auVar5[3] = -(this[3] == (dwarf)'V');
    auVar5[4] = -(this[4] == (dwarf)'I');
    auVar5[5] = -(this[5] == (dwarf)'R');
    auVar5[6] = -(this[6] == (dwarf)'T');
    auVar5[7] = -(this[7] == (dwarf)'U');
    auVar5[8] = -(this[8] == (dwarf)'A');
    auVar5[9] = -(this[9] == (dwarf)'L');
    auVar5[10] = -(this[10] == (dwarf)'I');
    auVar5[0xb] = -(this[0xb] == (dwarf)'T');
    auVar5[0xc] = -(this[0xc] == (dwarf)'Y');
    auVar5[0xd] = -(this[0xd] == (dwarf)'_');
    auVar5[0xe] = -(this[0xe] == (dwarf)'p');
    auVar5[0xf] = -(this[0xf] == (dwarf)'u');
    auVar5 = auVar5 & auVar8;
    uVar1 = (uint)((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) * 3 - 1;
  }
  else {
    uVar1 = 0xffffffff;
    if (pcVar2 == (char *)0x15) {
      auVar7[0] = -(this[5] == (dwarf)'R');
      auVar7[1] = -(this[6] == (dwarf)'T');
      auVar7[2] = -(this[7] == (dwarf)'U');
      auVar7[3] = -(this[8] == (dwarf)'A');
      auVar7[4] = -(this[9] == (dwarf)'L');
      auVar7[5] = -(this[10] == (dwarf)'I');
      auVar7[6] = -(this[0xb] == (dwarf)'T');
      auVar7[7] = -(this[0xc] == (dwarf)'Y');
      auVar7[8] = -(this[0xd] == (dwarf)'_');
      auVar7[9] = -(this[0xe] == (dwarf)'v');
      auVar7[10] = -(this[0xf] == (dwarf)'i');
      auVar7[0xb] = -(this[0x10] == (dwarf)'r');
      auVar7[0xc] = -(this[0x11] == (dwarf)'t');
      auVar7[0xd] = -(this[0x12] == (dwarf)'u');
      auVar7[0xe] = -(this[0x13] == (dwarf)'a');
      auVar7[0xf] = -(this[0x14] == (dwarf)'l');
      auVar4[0] = -(*this == (dwarf)'D');
      auVar4[1] = -(this[1] == (dwarf)'W');
      auVar4[2] = -(this[2] == (dwarf)'_');
      auVar4[3] = -(this[3] == (dwarf)'V');
      auVar4[4] = -(this[4] == (dwarf)'I');
      auVar4[5] = -(this[5] == (dwarf)'R');
      auVar4[6] = -(this[6] == (dwarf)'T');
      auVar4[7] = -(this[7] == (dwarf)'U');
      auVar4[8] = -(this[8] == (dwarf)'A');
      auVar4[9] = -(this[9] == (dwarf)'L');
      auVar4[10] = -(this[10] == (dwarf)'I');
      auVar4[0xb] = -(this[0xb] == (dwarf)'T');
      auVar4[0xc] = -(this[0xc] == (dwarf)'Y');
      auVar4[0xd] = -(this[0xd] == (dwarf)'_');
      auVar4[0xe] = -(this[0xe] == (dwarf)'v');
      auVar4[0xf] = -(this[0xf] == (dwarf)'i');
      auVar4 = auVar4 & auVar7;
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
        uVar1 = 1;
      }
    }
    else if ((pcVar2 == (char *)0x12) &&
            (auVar3[0] = -(*this == (dwarf)'D'), auVar3[1] = -(this[1] == (dwarf)'W'),
            auVar3[2] = -(this[2] == (dwarf)'_'), auVar3[3] = -(this[3] == (dwarf)'V'),
            auVar3[4] = -(this[4] == (dwarf)'I'), auVar3[5] = -(this[5] == (dwarf)'R'),
            auVar3[6] = -(this[6] == (dwarf)'T'), auVar3[7] = -(this[7] == (dwarf)'U'),
            auVar3[8] = -(this[8] == (dwarf)'A'), auVar3[9] = -(this[9] == (dwarf)'L'),
            auVar3[10] = -(this[10] == (dwarf)'I'), auVar3[0xb] = -(this[0xb] == (dwarf)'T'),
            auVar3[0xc] = -(this[0xc] == (dwarf)'Y'), auVar3[0xd] = -(this[0xd] == (dwarf)'_'),
            auVar3[0xe] = -(this[0xe] == (dwarf)'n'), auVar3[0xf] = -(this[0xf] == (dwarf)'o'),
            auVar6[0] = -((char)*(undefined2 *)(this + 0x10) == 'n'),
            auVar6[1] = -((char)((ushort)*(undefined2 *)(this + 0x10) >> 8) == 'e'),
            auVar6[2] = 0xff, auVar6[3] = 0xff, auVar6[4] = 0xff, auVar6[5] = 0xff, auVar6[6] = 0xff
            , auVar6[7] = 0xff, auVar6[8] = 0xff, auVar6[9] = 0xff, auVar6[10] = 0xff,
            auVar6[0xb] = 0xff, auVar6[0xc] = 0xff, auVar6[0xd] = 0xff, auVar6[0xe] = 0xff,
            auVar6[0xf] = 0xff, auVar6 = auVar6 & auVar3,
            (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff)) {
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getVirtuality(StringRef VirtualityString) {
  return StringSwitch<unsigned>(VirtualityString)
#define HANDLE_DW_VIRTUALITY(ID, NAME)                                         \
  .Case("DW_VIRTUALITY_" #NAME, DW_VIRTUALITY_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(DW_VIRTUALITY_invalid);
}